

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O1

void __thiscall
google::protobuf::util::converter::JsonStreamParser::~JsonStreamParser(JsonStreamParser *this)

{
  ~JsonStreamParser(this);
  operator_delete(this);
  return;
}

Assistant:

JsonStreamParser::~JsonStreamParser() {}